

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O3

void __thiscall
CharStringType2Interpreter::~CharStringType2Interpreter(CharStringType2Interpreter *this)

{
  pointer pCVar1;
  CharStringType2Interpreter *pCVar2;
  CharStringType2Interpreter *pCVar3;
  
  pCVar1 = (this->mStorage).
           super__Vector_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->mStorage).
                                 super__Vector_base<CharStringOperand,_std::allocator<CharStringOperand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  pCVar3 = (CharStringType2Interpreter *)
           (this->mOperandStack).
           super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (pCVar3 != this) {
    pCVar2 = (CharStringType2Interpreter *)
             (pCVar3->mOperandStack).
             super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node
             .super__List_node_base._M_next;
    operator_delete(pCVar3,0x20);
    pCVar3 = pCVar2;
  }
  return;
}

Assistant:

CharStringType2Interpreter::~CharStringType2Interpreter(void)
{
}